

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

pospopcnt_u16_method_type get_pospopcnt_u16_method(PPOPCNT_U16_METHODS method)

{
  PPOPCNT_U16_METHODS method_local;
  pospopcnt_u16_method_type local_8;
  
  switch(method) {
  case PPOPCNT_AUTO:
    local_8 = pospopcnt_u16;
    break;
  case PPOPCNT_SCALAR:
    local_8 = pospopcnt_u16_scalar_naive;
    break;
  case PPOPCNT_SCALAR_NOSIMD:
    local_8 = pospopcnt_u16_scalar_naive_nosimd;
    break;
  case PPOPCNT_SCALAR_PARTITION:
    local_8 = pospopcnt_u16_scalar_partition;
    break;
  case PPOPCNT_SCALAR_HIST1X4:
    local_8 = pospopcnt_u16_scalar_hist1x4;
    break;
  case PPOPCNT_SCALAR_UMUL128:
    local_8 = pospopcnt_u16_scalar_umul128;
    break;
  case PPOPCNT_SCALAR_UMUL128_UR2:
    local_8 = pospopcnt_u16_scalar_umul128_unroll2;
    break;
  case PPOPCNT_SSE_SINGLE:
    local_8 = pospopcnt_u16_sse_single;
    break;
  case PPOPCNT_SSE_BLEND_POPCNT:
    local_8 = pospopcnt_u16_sse_blend_popcnt;
    break;
  case PPOPCNT_SSE_BLEND_POPCNT_UR4:
    local_8 = pospopcnt_u16_sse_blend_popcnt_unroll4;
    break;
  case PPOPCNT_SSE_BLEND_POPCNT_UR8:
    local_8 = pospopcnt_u16_sse_blend_popcnt_unroll8;
    break;
  case PPOPCNT_SSE_BLEND_POPCNT_UR16:
    local_8 = pospopcnt_u16_sse_blend_popcnt_unroll16;
    break;
  case PPOPCNT_SSE_SAD:
    local_8 = pospopcnt_u16_sse_sad;
    break;
  case PPOPCNT_SSE_HARLEY_SEAL:
    local_8 = pospopcnt_u16_sse_harley_seal;
    break;
  case PPOPCNT_SSE_HARLEY_SEAL_IMPROVED:
    local_8 = pospopcnt_u16_sse_harley_seal_improved;
    break;
  case PPOPCNT_AVX2_POPCNT:
    local_8 = pospopcnt_u16_avx2_popcnt;
    break;
  case PPOPCNT_AVX2:
    local_8 = pospopcnt_u16_avx2;
    break;
  case PPOPCNT_AVX2_POPCNT_NAIVE:
    local_8 = pospopcnt_u16_avx2_naive_counter;
    break;
  case PPOPCNT_AVX2_SINGLE:
    local_8 = pospopcnt_u16_avx2_single;
    break;
  case PPOPCNT_AVX2_LEMIRE1:
    local_8 = pospopcnt_u16_avx2_lemire;
    break;
  case PPOPCNT_AVX2_LEMIRE2:
    local_8 = pospopcnt_u16_avx2_lemire2;
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT:
    local_8 = pospopcnt_u16_avx2_blend_popcnt;
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT_UR4:
    local_8 = pospopcnt_u16_avx2_blend_popcnt_unroll4;
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT_UR8:
    local_8 = pospopcnt_u16_avx2_blend_popcnt_unroll8;
    break;
  case PPOPCNT_AVX2_BLEND_POPCNT_UR16:
    local_8 = pospopcnt_u16_avx2_blend_popcnt_unroll16;
    break;
  case PPOPCNT_AVX2_ADDER_FOREST:
    local_8 = pospopcnt_u16_avx2_adder_forest;
    break;
  case PPOPCNT_AVX2_HARLEY_SEAL:
    local_8 = pospopcnt_u16_avx2_harley_seal;
    break;
  case PPOPCNT_AVX2_HARLEY_SEAL_IMPROVED:
    local_8 = pospopcnt_u16_avx2_harley_seal_improved;
    break;
  case PPOPCNT_AVX512:
    local_8 = pospopcnt_u16_avx512;
    break;
  case PPOPCNT_AVX512BW_MASK32:
    local_8 = pospopcnt_u16_avx512bw_popcnt32_mask;
    break;
  case PPOPCNT_AVX512BW_MASK64:
    local_8 = pospopcnt_u16_avx512bw_popcnt64_mask;
    break;
  case PPOPCNT_AVX512_MASKED_OPS:
    local_8 = pospopcnt_u16_avx512_masked_ops;
    break;
  case PPOPCNT_AVX512_POPCNT:
    local_8 = pospopcnt_u16_avx512_popcnt;
    break;
  case PPOPCNT_AVX512BW_BLEND_POPCNT:
    local_8 = pospopcnt_u16_avx512bw_blend_popcnt;
    break;
  case PPOPCNT_AVX512BW_BLEND_POPCNT_UR4:
    local_8 = pospopcnt_u16_avx512bw_blend_popcnt_unroll4;
    break;
  case PPOPCNT_AVX512BW_BLEND_POPCNT_UR8:
    local_8 = pospopcnt_u16_avx512bw_blend_popcnt_unroll8;
    break;
  case PPOPCNT_AVX512_MULA2:
    local_8 = pospopcnt_u16_avx512_mula2;
    break;
  case PPOPCNT_AVX512BW_ADDER_FOREST:
    local_8 = pospopcnt_u16_avx512bw_adder_forest;
    break;
  case PPOPCNT_AVX512BW_HARLEY_SEAL:
    local_8 = pospopcnt_u16_avx512bw_harley_seal;
    break;
  case PPOPCNT_AVX512VBMI_HARLEY_SEAL:
    local_8 = pospopcnt_u16_avx512vbmi_harley_seal;
    break;
  case PPOPCNT_NUMBER_METHODS:
  default:
    local_8 = (pospopcnt_u16_method_type)0x0;
  }
  return local_8;
}

Assistant:

pospopcnt_u16_method_type get_pospopcnt_u16_method(PPOPCNT_U16_METHODS method) {
    switch(method) {
    case(PPOPCNT_AUTO): return pospopcnt_u16;
    case(PPOPCNT_SCALAR): return pospopcnt_u16_scalar_naive;
    case(PPOPCNT_SCALAR_NOSIMD): return pospopcnt_u16_scalar_naive_nosimd;
    case(PPOPCNT_SCALAR_PARTITION): return pospopcnt_u16_scalar_partition;
    case(PPOPCNT_SCALAR_HIST1X4): return pospopcnt_u16_scalar_hist1x4;
    case(PPOPCNT_SCALAR_UMUL128): return pospopcnt_u16_scalar_umul128;
    case(PPOPCNT_SCALAR_UMUL128_UR2): return pospopcnt_u16_scalar_umul128_unroll2;
    case(PPOPCNT_SSE_SINGLE): return pospopcnt_u16_sse_single;
    case(PPOPCNT_SSE_BLEND_POPCNT): return pospopcnt_u16_sse_blend_popcnt;
    case(PPOPCNT_SSE_BLEND_POPCNT_UR4): return pospopcnt_u16_sse_blend_popcnt_unroll4;
    case(PPOPCNT_SSE_BLEND_POPCNT_UR8): return pospopcnt_u16_sse_blend_popcnt_unroll8;
    case(PPOPCNT_SSE_BLEND_POPCNT_UR16): return pospopcnt_u16_sse_blend_popcnt_unroll16;
    case(PPOPCNT_SSE_SAD): return pospopcnt_u16_sse_sad;
    case(PPOPCNT_SSE_HARLEY_SEAL): return pospopcnt_u16_sse_harley_seal;
    case(PPOPCNT_SSE_HARLEY_SEAL_IMPROVED): return pospopcnt_u16_sse_harley_seal_improved;
    case(PPOPCNT_AVX2_POPCNT): return pospopcnt_u16_avx2_popcnt;
    case(PPOPCNT_AVX2): return pospopcnt_u16_avx2;
    case(PPOPCNT_AVX2_POPCNT_NAIVE): return pospopcnt_u16_avx2_naive_counter;
    case(PPOPCNT_AVX2_SINGLE): return pospopcnt_u16_avx2_single;
    case(PPOPCNT_AVX2_LEMIRE1): return pospopcnt_u16_avx2_lemire;
    case(PPOPCNT_AVX2_LEMIRE2): return pospopcnt_u16_avx2_lemire2;
    case(PPOPCNT_AVX2_BLEND_POPCNT): return pospopcnt_u16_avx2_blend_popcnt;
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR4): return pospopcnt_u16_avx2_blend_popcnt_unroll4;
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR8): return pospopcnt_u16_avx2_blend_popcnt_unroll8;
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR16): return pospopcnt_u16_avx2_blend_popcnt_unroll16;
    case(PPOPCNT_AVX2_ADDER_FOREST): return pospopcnt_u16_avx2_adder_forest;
    case(PPOPCNT_AVX2_HARLEY_SEAL): return pospopcnt_u16_avx2_harley_seal;
    case(PPOPCNT_AVX2_HARLEY_SEAL_IMPROVED): return pospopcnt_u16_avx2_harley_seal_improved;
    case(PPOPCNT_AVX512): return pospopcnt_u16_avx512;
    case(PPOPCNT_AVX512BW_MASK32): return pospopcnt_u16_avx512bw_popcnt32_mask;
    case(PPOPCNT_AVX512BW_MASK64): return pospopcnt_u16_avx512bw_popcnt64_mask;
    case(PPOPCNT_AVX512_MASKED_OPS): return pospopcnt_u16_avx512_masked_ops;
    case(PPOPCNT_AVX512_POPCNT): return pospopcnt_u16_avx512_popcnt;
    case(PPOPCNT_AVX512BW_BLEND_POPCNT): return pospopcnt_u16_avx512bw_blend_popcnt;
    case(PPOPCNT_AVX512BW_BLEND_POPCNT_UR4): return pospopcnt_u16_avx512bw_blend_popcnt_unroll4;
    case(PPOPCNT_AVX512BW_BLEND_POPCNT_UR8): return pospopcnt_u16_avx512bw_blend_popcnt_unroll8;
    case(PPOPCNT_AVX512BW_ADDER_FOREST): return pospopcnt_u16_avx512bw_adder_forest;
    case(PPOPCNT_AVX512_MULA2): return pospopcnt_u16_avx512_mula2;
    case(PPOPCNT_AVX512BW_HARLEY_SEAL): return pospopcnt_u16_avx512bw_harley_seal;
    case(PPOPCNT_AVX512VBMI_HARLEY_SEAL): return pospopcnt_u16_avx512vbmi_harley_seal;
    case PPOPCNT_NUMBER_METHODS: break; /* -Wswitch */
    }
    assert(0);
    return 0; /* unreachable, but some compilers complain without it */
}